

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::ValidationErrorCollector::AddError
          (ValidationErrorCollector *this,string *filename,string *element_name,Message *descriptor,
          ErrorLocation location,string *message)

{
  long *plVar1;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  Message *unaff_retaddr;
  SourceLocationTable *in_stack_00000008;
  int column;
  int line;
  undefined4 in_stack_00000020;
  undefined4 local_38;
  undefined4 local_34;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x18) != 0) {
    if (in_R8D == 9) {
      SourceLocationTable::FindImport
                ((SourceLocationTable *)descriptor,(Message *)CONCAT44(location,in_stack_00000020),
                 message,_column,(int *)in_stack_00000008);
    }
    else {
      SourceLocationTable::Find
                (in_stack_00000008,unaff_retaddr,(ErrorLocation)((ulong)in_RDI >> 0x20),in_RSI,
                 in_RDX);
    }
    plVar1 = *(long **)(*(long *)(in_RDI + 8) + 0x18);
    (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,local_34,local_38,in_R9);
  }
  return;
}

Assistant:

void SourceTreeDescriptorDatabase::ValidationErrorCollector::AddError(
    const std::string& filename, const std::string& element_name,
    const Message* descriptor, ErrorLocation location,
    const std::string& message) {
  if (owner_->error_collector_ == NULL) return;

  int line, column;
  if (location == DescriptorPool::ErrorCollector::IMPORT) {
    owner_->source_locations_.FindImport(descriptor, element_name, &line,
                                         &column);
  } else {
    owner_->source_locations_.Find(descriptor, location, &line, &column);
  }
  owner_->error_collector_->AddError(filename, line, column, message);
}